

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLSLUtils.cpp
# Opt level: O3

void Diligent::GetGLSLVersion
               (ShaderCreateInfo *ShaderCI,TargetGLSLCompiler TargetCompiler,
               RENDER_DEVICE_TYPE DeviceType,RenderDeviceShaderVersionInfo *MaxShaderVersion,
               ShaderVersion *GLSLVer,bool *IsES)

{
  ShaderVersion SVar1;
  bool bVar2;
  uint uVar3;
  Version VVar4;
  ulong uVar5;
  uint uVar6;
  char (*in_stack_ffffffffffffffb8) [2];
  ShaderVersion CompilerVer;
  string _msg;
  
  *IsES = DeviceType == RENDER_DEVICE_TYPE_GLES;
  VVar4 = (&MaxShaderVersion->GLSL)[DeviceType == RENDER_DEVICE_TYPE_GLES];
  CompilerVer = VVar4;
  if (DeviceType == RENDER_DEVICE_TYPE_GLES && TargetCompiler == glslang) {
    bVar2 = (ulong)VVar4 >> 0x21 != 0;
    if (VVar4.Major != 3) {
      bVar2 = 3 < VVar4.Major;
    }
    CompilerVer.Major = 3;
    CompilerVer.Minor = 1;
    if (bVar2) {
      CompilerVer = VVar4;
    }
    VVar4 = (Version)((ulong)CompilerVer & 0xffffffff);
  }
  uVar5 = (ulong)CompilerVer >> 0x20;
  SVar1 = (&ShaderCI->GLSLVersion)[DeviceType == RENDER_DEVICE_TYPE_GLES];
  *GLSLVer = SVar1;
  uVar6 = SVar1.Major;
  uVar3 = VVar4.Major;
  if (uVar6 == 0 && (ulong)SVar1 >> 0x20 == 0) {
    VVar4 = CompilerVer;
    if ((uVar5 == 0 && uVar3 == 0) && (VVar4.Major = 4, VVar4.Minor = 3, *IsES == true)) {
      FormatString<char[26],char[6]>
                (&_msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"!IsES",
                 (char (*) [6])CONCAT71(CompilerVer._1_7_ >> 0x20,uVar5 != 0 || uVar3 != 0));
      DebugAssertionFailed
                (_msg._M_dataplus._M_p,"GetGLSLVersion",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLUtils.cpp"
                 ,0x6e);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_msg._M_dataplus._M_p != &_msg.field_2) {
        operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    if (uVar5 == 0 && uVar3 == 0) {
      return;
    }
    bVar2 = CompilerVer.Minor < SVar1.Minor;
    if (uVar3 != uVar6) {
      bVar2 = uVar3 < uVar6;
    }
    if (!bVar2) {
      return;
    }
    FormatString<char[25],unsigned_int,char[2],unsigned_int,char[50],unsigned_int,char[2],unsigned_int,char[2]>
              (&_msg,(Diligent *)"Requested GLSL version (",(char (*) [25])GLSLVer,(uint *)0x363ffe,
               (char (*) [2])&GLSLVer->Minor,
               (uint *)") is greater than the maximum supported version (",
               (char (*) [50])&CompilerVer,(uint *)0x363ffe,(char (*) [2])&CompilerVer.Minor,
               (uint *)0x343766,in_stack_ffffffffffffffb8);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(1,_msg._M_dataplus._M_p,0,0,0);
    }
    VVar4 = CompilerVer;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_msg._M_dataplus._M_p != &_msg.field_2) {
      operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
      VVar4 = CompilerVer;
    }
  }
  GLSLVer->Major = VVar4.Major;
  GLSLVer->Minor = VVar4.Minor;
  return;
}

Assistant:

void GetGLSLVersion(const ShaderCreateInfo&              ShaderCI,
                    TargetGLSLCompiler                   TargetCompiler,
                    RENDER_DEVICE_TYPE                   DeviceType,
                    const RenderDeviceShaderVersionInfo& MaxShaderVersion,
                    ShaderVersion&                       GLSLVer,
                    bool&                                IsES)
{
    IsES = IsESSL(DeviceType);

    ShaderVersion CompilerVer = IsES ? MaxShaderVersion.GLESSL : MaxShaderVersion.GLSL;
    if (TargetCompiler == TargetGLSLCompiler::glslang)
    {
        if (IsES)
        {
            // glslang requires at least GLES3.1
            CompilerVer = ShaderVersion::Max(CompilerVer, ShaderVersion{3, 1});
        }
        else
        {
#if PLATFORM_APPLE
            CompilerVer = ShaderVersion{4, 3};
#endif
        }
    }

    GLSLVer = IsES ? ShaderCI.GLESSLVersion : ShaderCI.GLSLVersion;
    if (GLSLVer != ShaderVersion{})
    {
        if (CompilerVer != ShaderVersion{} && GLSLVer > CompilerVer)
        {
            LOG_WARNING_MESSAGE("Requested GLSL version (", GLSLVer.Major, ".", GLSLVer.Minor,
                                ") is greater than the maximum supported version (",
                                CompilerVer.Major, ".", CompilerVer.Minor, ")");
            GLSLVer = CompilerVer;
        }
    }
    else if (CompilerVer != ShaderVersion{})
    {
        GLSLVer = CompilerVer;
    }
    else
    {
#if PLATFORM_WIN32 || PLATFORM_LINUX
        {
            VERIFY_EXPR(!IsES);
            GLSLVer = {4, 3};
        }
#elif PLATFORM_MACOS
        {
            VERIFY_EXPR(!IsES);
            VERIFY_EXPR(TargetCompiler == TargetGLSLCompiler::driver);
            GLSLVer = {4, 1};
        }
#elif PLATFORM_ANDROID || PLATFORM_IOS || PLATFORM_TVOS || PLATFORM_WEB
        {
            VERIFY_EXPR(IsES);
            if (DeviceType == RENDER_DEVICE_TYPE_VULKAN || DeviceType == RENDER_DEVICE_TYPE_METAL)
            {
                GLSLVer = {3, 1};
            }
            else if (DeviceType == RENDER_DEVICE_TYPE_GLES)
            {
                GLSLVer = {3, 0};
            }
            else
            {
                UNEXPECTED("Unexpected device type");
            }
        }
#else
#    error Unknown platform
#endif
    }
}